

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeywordExtractor.hpp
# Opt level: O3

void __thiscall
cppjieba::KeywordExtractor::Extract
          (KeywordExtractor *this,string *sentence,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *keywords,size_t topN)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pWVar3;
  long lVar4;
  ulong uVar5;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  topWords;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_58;
  
  local_78.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Extract(this,sentence,&local_78,topN);
  if (local_78.
      super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_78.
      super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar1 = &local_58.first.field_2;
    lVar4 = 0;
    uVar5 = 0;
    do {
      pWVar3 = local_78.
               super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)((long)&((local_78.
                                 super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->word)._M_dataplus._M_p
                       + lVar4);
      local_58.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,lVar2,
                 *(long *)((long)&((local_78.
                                    super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->word).
                                  _M_string_length + lVar4) + lVar2);
      local_58.second = *(double *)((long)&pWVar3->weight + lVar4);
      std::
      vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
      ::emplace_back<std::pair<std::__cxx11::string,double>>
                ((vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
                  *)keywords,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.first._M_dataplus._M_p);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < (ulong)((long)local_78.
                                   super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.
                                   super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>::
  ~vector(&local_78);
  return;
}

Assistant:

void Extract(const string& sentence, vector<pair<string, double> >& keywords, size_t topN) const {
    vector<Word> topWords;
    Extract(sentence, topWords, topN);
    for (size_t i = 0; i < topWords.size(); i++) {
      keywords.push_back(pair<string, double>(topWords[i].word, topWords[i].weight));
    }
  }